

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O3

void __thiscall Handler::Migrate(Handler *this)

{
  pointer pPVar1;
  long lVar2;
  uint32_t *puVar3;
  LOCATION LVar4;
  ulong uVar5;
  pointer pPVar6;
  bool bVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  __normal_iterator<PurchasedServer_*,_std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>_>
  __i;
  pointer pPVar11;
  uint32_t *deployedVMIdx;
  uint uVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  allocator_type local_61;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  uint32_t *local_48;
  uint32_t *local_40;
  
  uVar12 = this->deployedVMNum * 3;
  if (99 < uVar12) {
    pPVar6 = (this->purchasedServers).
             super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar1 = (this->purchasedServers).
             super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar6 != pPVar1) {
      uVar5 = ((long)pPVar1 - (long)pPVar6 >> 3) * -0x71c71c71c71c71c7;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<PurchasedServer*,std::vector<PurchasedServer,std::allocator<PurchasedServer>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Handler::Migrate()::__0>>
                (pPVar6,pPVar1,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pPVar1 - (long)pPVar6 < 0x481) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<PurchasedServer*,std::vector<PurchasedServer,std::allocator<PurchasedServer>>>,__gnu_cxx::__ops::_Iter_comp_iter<Handler::Migrate()::__0>>
                  (pPVar6,pPVar1);
      }
      else {
        pPVar11 = pPVar6 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<PurchasedServer*,std::vector<PurchasedServer,std::allocator<PurchasedServer>>>,__gnu_cxx::__ops::_Iter_comp_iter<Handler::Migrate()::__0>>
                  (pPVar6,pPVar11);
        for (; pPVar11 != pPVar1; pPVar11 = pPVar11 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<PurchasedServer*,std::vector<PurchasedServer,std::allocator<PurchasedServer>>>,__gnu_cxx::__ops::_Val_comp_iter<Handler::Migrate()::__0>>
                    (pPVar11);
        }
      }
    }
    pPVar6 = (this->purchasedServers).
             super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = ((long)(this->purchasedServers).
                    super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pPVar6 >> 3) * -0x71c71c71c71c71c7;
    uVar5 = uVar10 & 0xffff;
    if (uVar5 != 0) {
      uVar8 = 0;
      do {
        this->purchasedServerIdxMap[pPVar6->id] = (uint16_t)uVar8;
        uVar8 = uVar8 + 1;
        pPVar6 = pPVar6 + 1;
      } while (uVar5 != uVar8);
    }
    uVar9 = (uint)uVar10;
    if ((int)uVar9 < 1) {
      local_60 = 0;
    }
    else {
      local_50 = (ulong)uVar12 / 100;
      local_60 = 0;
      bVar7 = false;
      local_58 = (ulong)(uVar9 & 0x7fffffff);
      do {
        uVar5 = local_58 - 1;
        pPVar6 = (this->purchasedServers).
                 super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        vector<std::__detail::_Node_iterator<unsigned_int,true,false>,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,
                   (_Node_iterator<unsigned_int,_true,_false>)
                   pPVar6[uVar5].deployedVM._M_h._M_before_begin._M_nxt,
                   (_Node_iterator<unsigned_int,_true,_false>)0x0,&local_61);
        SortDeployedVM(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
        puVar3 = local_40;
        uVar10 = local_58;
        if (local_48 != local_40) {
          deployedVMIdx = local_48;
          do {
            if (bVar7) break;
            if (1 < uVar10) {
              uVar8 = 0;
              do {
                uVar12 = (uint)((int)uVar8 + (int)uVar5) >> 1;
                LVar4 = Migrate(this,pPVar6 + uVar5,
                                (this->purchasedServers).
                                super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar12,deployedVMIdx);
                uVar10 = local_58;
                if (LVar4 != NONE) {
                  uVar12 = (int)local_60 + 1;
                  local_60 = (ulong)uVar12;
                  if ((uint)local_50 <= uVar12) {
                    bVar7 = true;
                  }
                  break;
                }
                uVar8 = (ulong)(uVar12 + 1);
              } while ((long)uVar8 < (long)uVar5);
            }
            deployedVMIdx = deployedVMIdx + 1;
          } while (deployedVMIdx != puVar3);
        }
        if (local_48 != (uint32_t *)0x0) {
          operator_delete(local_48);
        }
      } while ((1 < (long)uVar10) && (local_58 = uVar5, !bVar7));
    }
    this->totalMigrationNum = this->totalMigrationNum + (int)local_60;
  }
  return;
}

Assistant:

void Handler::Migrate() {
    uint32_t threshold = deployedVMNum * 3u / 100u;
    uint32_t migrateNum = 0u;
    bool ended = (migrateNum >= threshold);
    if (ended) return;

    // 将 purchasedServers 按照剩余容量升序排列
    std::sort(purchasedServers.begin(), purchasedServers.end(), [](const PurchasedServer &a, const PurchasedServer &b) {
        return a.vacancyRate != b.vacancyRate ? a.vacancyRate < b.vacancyRate :
               a.remainCpuCoreA + a.remainCpuCoreB + a.remainMemorySizeA + a.remainMemorySizeB <
               b.remainCpuCoreA + b.remainCpuCoreB + b.remainMemorySizeA + b.remainMemorySizeB;;
    });
    // 排序后需要重新映射 purchasedServer id -> purchasedServers index
    ReMapPurchasedServerIdx();

    // originPurchasedServer -> destPurchasedServer
    for (int i = (int) purchasedServers.size() - 1; i >= 0 && !ended; --i) {
        PurchasedServer &originPurchasedServer = purchasedServers[i];
        std::unordered_set<uint32_t> &deployedVM = originPurchasedServer.deployedVM;
        std::vector<uint32_t> tmp(deployedVM.begin(), deployedVM.end());
        SortDeployedVM(tmp);

        for (const uint32_t &deployedVMIdx : tmp) {
            if (ended) break;

            int left = 0, right = i, mid;
            while (left < right) {
                mid = (left + right) / 2;
                PurchasedServer &destPurchasedServer = purchasedServers[mid];
                if (Migrate(originPurchasedServer, destPurchasedServer, deployedVMIdx) != NONE) {
                    if (++migrateNum >= threshold) ended = true;
                    break;
                } else {
                    left = mid + 1;
                }
            }
        }
    }

#ifdef TEST
    totalMigrationNum += migrateNum;
#endif
}